

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::Tokenizer::NextWithComments
          (Tokenizer *this,string *prev_trailing_comments,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments,string *next_leading_comments)

{
  bool bVar1;
  undefined1 uVar2;
  NextCommentStatus NVar3;
  Tokenizer *this_00;
  int *in_RDI;
  bool result;
  CommentCollector collector;
  undefined4 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefd;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 uVar4;
  undefined1 in_stack_fffffffffffffeff;
  Tokenizer *in_stack_ffffffffffffff00;
  Tokenizer *in_stack_ffffffffffffff08;
  Tokenizer *in_stack_ffffffffffffff10;
  allocator local_99;
  string local_98 [96];
  Tokenizer *in_stack_ffffffffffffffc8;
  Tokenizer *in_stack_ffffffffffffffd0;
  bool local_1;
  
  anon_unknown_4::CommentCollector::CommentCollector
            ((CommentCollector *)in_stack_ffffffffffffff10,(string *)in_stack_ffffffffffffff08,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff00,
             (string *)
             CONCAT17(in_stack_fffffffffffffeff,
                      CONCAT16(in_stack_fffffffffffffefe,
                               CONCAT15(in_stack_fffffffffffffefd,
                                        CONCAT14(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                                                )))));
  if (*in_RDI == 0) {
    bVar1 = TryConsume(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38));
    if ((!bVar1) ||
       ((bVar1 = TryConsume(in_stack_ffffffffffffff08,
                            (char)((ulong)in_stack_ffffffffffffff00 >> 0x38)), bVar1 &&
        (bVar1 = TryConsume(in_stack_ffffffffffffff08,
                            (char)((ulong)in_stack_ffffffffffffff00 >> 0x38)), bVar1)))) {
      anon_unknown_4::CommentCollector::DetachFromPrev((CommentCollector *)(local_98 + 0x30));
      goto switchD_00549fbf_default;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,
               "Proto file starts with 0xEF but not UTF-8 BOM. Only UTF-8 is accepted for proto file."
               ,&local_99);
    AddError(in_stack_ffffffffffffff00,
             (string *)
             CONCAT17(in_stack_fffffffffffffeff,
                      CONCAT16(in_stack_fffffffffffffefe,
                               CONCAT15(in_stack_fffffffffffffefd,
                                        CONCAT14(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                                                )))));
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    local_1 = false;
  }
  else {
    ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>
              (in_stack_ffffffffffffff00);
    NVar3 = TryConsumeCommentStart
                      ((Tokenizer *)
                       CONCAT17(in_stack_fffffffffffffeff,
                                CONCAT16(in_stack_fffffffffffffefe,
                                         CONCAT15(in_stack_fffffffffffffefd,
                                                  CONCAT14(in_stack_fffffffffffffefc,
                                                           in_stack_fffffffffffffef8)))));
    switch(NVar3) {
    case LINE_COMMENT:
      (anonymous_namespace)::CommentCollector::GetBufferForLineComment_abi_cxx11_
                ((CommentCollector *)in_stack_ffffffffffffff00);
      ConsumeLineComment(in_stack_ffffffffffffff10,(string *)in_stack_ffffffffffffff08);
      anon_unknown_4::CommentCollector::Flush((CommentCollector *)in_stack_ffffffffffffff00);
    default:
switchD_00549fbf_default:
      do {
        ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>
                  (in_stack_ffffffffffffff00);
        NVar3 = TryConsumeCommentStart
                          ((Tokenizer *)
                           CONCAT17(in_stack_fffffffffffffeff,
                                    CONCAT16(in_stack_fffffffffffffefe,
                                             CONCAT15(in_stack_fffffffffffffefd,
                                                      CONCAT14(in_stack_fffffffffffffefc,
                                                               in_stack_fffffffffffffef8)))));
        this_00 = (Tokenizer *)(ulong)NVar3;
        switch(this_00) {
        case (Tokenizer *)0x0:
          in_stack_ffffffffffffff08 =
               (Tokenizer *)
               (anonymous_namespace)::CommentCollector::GetBufferForLineComment_abi_cxx11_
                         ((CommentCollector *)in_stack_ffffffffffffff00);
          ConsumeLineComment(this_00,(string *)in_stack_ffffffffffffff08);
          break;
        case (Tokenizer *)0x1:
          in_stack_ffffffffffffff00 =
               (Tokenizer *)
               (anonymous_namespace)::CommentCollector::GetBufferForBlockComment_abi_cxx11_
                         ((CommentCollector *)in_stack_ffffffffffffff00);
          ConsumeBlockComment(in_stack_ffffffffffffffd0,(string *)in_stack_ffffffffffffffc8);
          ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>
                    (in_stack_ffffffffffffff00);
          TryConsume(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38));
          break;
        case (Tokenizer *)0x2:
          goto switchD_00549fbf_caseD_2;
        case (Tokenizer *)0x3:
          in_stack_fffffffffffffeff =
               TryConsume(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38)
                         );
          if (!(bool)in_stack_fffffffffffffeff) {
            local_1 = Next(in_stack_ffffffffffffffc8);
            if ((((!local_1) ||
                 (uVar4 = local_1,
                 uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_ffffffffffffff00,
                                         (char *)CONCAT17(in_stack_fffffffffffffeff,
                                                          CONCAT16(local_1,CONCAT15(
                                                  in_stack_fffffffffffffefd,
                                                  CONCAT14(in_stack_fffffffffffffefc,
                                                           in_stack_fffffffffffffef8))))),
                 (bool)uVar2)) ||
                (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_ffffffffffffff00,
                                         (char *)CONCAT17(in_stack_fffffffffffffeff,
                                                          CONCAT16(uVar4,CONCAT15(uVar2,CONCAT14(
                                                  in_stack_fffffffffffffefc,
                                                  in_stack_fffffffffffffef8))))), bVar1)) ||
               (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffff00,
                                        (char *)CONCAT17(in_stack_fffffffffffffeff,
                                                         CONCAT16(uVar4,CONCAT15(uVar2,CONCAT14(
                                                  bVar1,in_stack_fffffffffffffef8))))), bVar1)) {
              anon_unknown_4::CommentCollector::Flush((CommentCollector *)in_stack_ffffffffffffff00)
              ;
            }
            goto LAB_0054a148;
          }
          anon_unknown_4::CommentCollector::Flush((CommentCollector *)in_stack_ffffffffffffff00);
          anon_unknown_4::CommentCollector::DetachFromPrev((CommentCollector *)(local_98 + 0x30));
        }
      } while( true );
    case BLOCK_COMMENT:
      (anonymous_namespace)::CommentCollector::GetBufferForBlockComment_abi_cxx11_
                ((CommentCollector *)in_stack_ffffffffffffff00);
      ConsumeBlockComment(in_stack_ffffffffffffffd0,(string *)in_stack_ffffffffffffffc8);
      ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>
                (in_stack_ffffffffffffff00);
      bVar1 = TryConsume(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38))
      ;
      if (bVar1) {
        anon_unknown_4::CommentCollector::Flush((CommentCollector *)in_stack_ffffffffffffff00);
        goto switchD_00549fbf_default;
      }
      anon_unknown_4::CommentCollector::ClearBuffer((CommentCollector *)in_stack_ffffffffffffff00);
      local_1 = Next(in_stack_ffffffffffffffc8);
      break;
    case SLASH_NOT_COMMENT:
      local_1 = true;
      break;
    case NO_COMMENT:
      bVar1 = TryConsume(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38))
      ;
      if (bVar1) goto switchD_00549fbf_default;
      local_1 = Next(in_stack_ffffffffffffffc8);
    }
  }
  goto LAB_0054a148;
switchD_00549fbf_caseD_2:
  local_1 = true;
LAB_0054a148:
  anon_unknown_4::CommentCollector::~CommentCollector((CommentCollector *)in_stack_ffffffffffffff00)
  ;
  return local_1;
}

Assistant:

bool Tokenizer::NextWithComments(std::string* prev_trailing_comments,
                                 std::vector<std::string>* detached_comments,
                                 std::string* next_leading_comments) {
  CommentCollector collector(prev_trailing_comments, detached_comments,
                             next_leading_comments);

  if (current_.type == TYPE_START) {
    // Ignore unicode byte order mark(BOM) if it appears at the file
    // beginning. Only UTF-8 BOM (0xEF 0xBB 0xBF) is accepted.
    if (TryConsume((char)0xEF)) {
      if (!TryConsume((char)0xBB) || !TryConsume((char)0xBF)) {
        AddError(
            "Proto file starts with 0xEF but not UTF-8 BOM. "
            "Only UTF-8 is accepted for proto file.");
        return false;
      }
    }
    collector.DetachFromPrev();
  } else {
    // A comment appearing on the same line must be attached to the previous
    // declaration.
    ConsumeZeroOrMore<WhitespaceNoNewline>();
    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(collector.GetBufferForLineComment());

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());

        ConsumeZeroOrMore<WhitespaceNoNewline>();
        if (!TryConsume('\n')) {
          // Oops, the next token is on the same line.  If we recorded a comment
          // we really have no idea which token it should be attached to.
          collector.ClearBuffer();
          return Next();
        }

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (!TryConsume('\n')) {
          // The next token is on the same line.  There are no comments.
          return Next();
        }
        break;
    }
  }

  // OK, we are now on the line *after* the previous token.
  while (true) {
    ConsumeZeroOrMore<WhitespaceNoNewline>();

    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(collector.GetBufferForLineComment());
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());

        // Consume the rest of the line so that we don't interpret it as a
        // blank line the next time around the loop.
        ConsumeZeroOrMore<WhitespaceNoNewline>();
        TryConsume('\n');
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (TryConsume('\n')) {
          // Completely blank line.
          collector.Flush();
          collector.DetachFromPrev();
        } else {
          bool result = Next();
          if (!result || current_.text == "}" || current_.text == "]" ||
              current_.text == ")") {
            // It looks like we're at the end of a scope.  In this case it
            // makes no sense to attach a comment to the following token.
            collector.Flush();
          }
          return result;
        }
        break;
    }
  }
}